

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::SampleMaskInstance::iterate
          (TestStatus *__return_storage_ptr__,SampleMaskInstance *this)

{
  IVec2 *renderSize;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices;
  VkPipelineMultisampleStateCreateInfo *multisampleStateParams;
  VkPipelineColorBlendAttachmentState *blendState;
  TextureLevel *pTVar1;
  undefined8 uVar2;
  VkSampleCountFlagBits VVar3;
  UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> local_388;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> maxSampleMaskImage;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> minSampleMaskImage;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> testSampleMaskImage;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampleMask;
  MultisampleRenderer renderer;
  
  testSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
  m_data.ptr = (TextureLevel *)0x0;
  minSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
  m_data.ptr = (TextureLevel *)0x0;
  maxSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
  m_data.ptr = (TextureLevel *)0x0;
  renderSize = &this->m_renderSize;
  vertices = &this->m_vertices;
  multisampleStateParams = &this->m_multisampleStateParams;
  blendState = &this->m_colorBlendState;
  MultisampleRenderer::MultisampleRenderer
            (&renderer,(this->super_TestInstance).m_context,this->m_colorFormat,renderSize,
             this->m_primitiveTopology,vertices,multisampleStateParams,blendState);
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams,&renderer);
  uVar2 = multisampleParams._0_8_;
  multisampleParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  multisampleParams._4_4_ = 0;
  if (testSampleMaskImage.
      super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr !=
      (TextureLevel *)uVar2) {
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
              (&testSampleMaskImage.
                super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
    testSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
    m_data.ptr = (TextureLevel *)uVar2;
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
             &multisampleParams);
  MultisampleRenderer::~MultisampleRenderer(&renderer);
  multisampleParams.sType = multisampleStateParams->sType;
  multisampleParams._4_4_ = *(undefined4 *)&multisampleStateParams->field_0x4;
  multisampleParams.pNext = (this->m_multisampleStateParams).pNext;
  multisampleParams.flags = (this->m_multisampleStateParams).flags;
  multisampleParams.rasterizationSamples = (this->m_multisampleStateParams).rasterizationSamples;
  multisampleParams.sampleShadingEnable = (this->m_multisampleStateParams).sampleShadingEnable;
  multisampleParams.minSampleShading = (this->m_multisampleStateParams).minSampleShading;
  multisampleParams.pSampleMask = (this->m_multisampleStateParams).pSampleMask;
  multisampleParams.alphaToCoverageEnable = (this->m_multisampleStateParams).alphaToCoverageEnable;
  multisampleParams.alphaToOneEnable = (this->m_multisampleStateParams).alphaToOneEnable;
  VVar3 = multisampleParams.rasterizationSamples +
          (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT|
          VK_SAMPLE_COUNT_1_BIT);
  if (-1 < (long)multisampleParams._16_8_) {
    VVar3 = multisampleParams.rasterizationSamples;
  }
  renderer._vptr_MultisampleRenderer._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&sampleMask,(long)((int)VVar3 >> 5),(value_type_conflict1 *)&renderer,
             (allocator_type *)&local_388);
  multisampleParams.pSampleMask =
       sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  MultisampleRenderer::MultisampleRenderer
            (&renderer,(this->super_TestInstance).m_context,this->m_colorFormat,renderSize,
             this->m_primitiveTopology,vertices,&multisampleParams,blendState);
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_388,
             &renderer);
  pTVar1 = local_388.m_data.ptr;
  local_388.m_data.ptr = (TextureLevel *)0x0;
  if (minSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
      .m_data.ptr != pTVar1) {
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
              (&minSampleMaskImage.
                super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
    minSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
    m_data.ptr = pTVar1;
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_388);
  MultisampleRenderer::~MultisampleRenderer(&renderer);
  if (sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  multisampleParams.sType = multisampleStateParams->sType;
  multisampleParams._4_4_ = *(undefined4 *)&multisampleStateParams->field_0x4;
  multisampleParams.pNext = (this->m_multisampleStateParams).pNext;
  multisampleParams.flags = (this->m_multisampleStateParams).flags;
  multisampleParams.rasterizationSamples = (this->m_multisampleStateParams).rasterizationSamples;
  multisampleParams.sampleShadingEnable = (this->m_multisampleStateParams).sampleShadingEnable;
  multisampleParams.minSampleShading = (this->m_multisampleStateParams).minSampleShading;
  multisampleParams.pSampleMask = (this->m_multisampleStateParams).pSampleMask;
  multisampleParams.alphaToCoverageEnable = (this->m_multisampleStateParams).alphaToCoverageEnable;
  multisampleParams.alphaToOneEnable = (this->m_multisampleStateParams).alphaToOneEnable;
  VVar3 = multisampleParams.rasterizationSamples +
          (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT|
          VK_SAMPLE_COUNT_1_BIT);
  if (-1 < (long)multisampleParams._16_8_) {
    VVar3 = multisampleParams.rasterizationSamples;
  }
  renderer._vptr_MultisampleRenderer._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&sampleMask,(long)((int)VVar3 >> 5),(value_type_conflict1 *)&renderer,
             (allocator_type *)&local_388);
  multisampleParams.pSampleMask =
       sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  MultisampleRenderer::MultisampleRenderer
            (&renderer,(this->super_TestInstance).m_context,this->m_colorFormat,renderSize,
             this->m_primitiveTopology,vertices,&multisampleParams,blendState);
  MultisampleRenderer::render
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&local_388,
             &renderer);
  pTVar1 = local_388.m_data.ptr;
  local_388.m_data.ptr = (TextureLevel *)0x0;
  if (maxSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
      .m_data.ptr != pTVar1) {
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
              (&maxSampleMaskImage.
                super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
    maxSampleMaskImage.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
    m_data.ptr = pTVar1;
  }
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&local_388);
  MultisampleRenderer::~MultisampleRenderer(&renderer);
  if (sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sampleMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&renderer,
             testSampleMaskImage.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&multisampleParams,
             minSampleMaskImage.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&sampleMask,
             maxSampleMaskImage.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  (*(this->super_TestInstance)._vptr_TestInstance[3])
            (__return_storage_ptr__,this,&renderer,&multisampleParams,&sampleMask);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&maxSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&minSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&testSampleMaskImage.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SampleMaskInstance::iterate (void)
{
	de::MovePtr<tcu::TextureLevel>				testSampleMaskImage;
	de::MovePtr<tcu::TextureLevel>				minSampleMaskImage;
	de::MovePtr<tcu::TextureLevel>				maxSampleMaskImage;

	// Render with test flags
	{
		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, m_multisampleStateParams, m_colorBlendState);
		testSampleMaskImage = renderer.render();
	}

	// Render with all flags off
	{
		VkPipelineMultisampleStateCreateInfo	multisampleParams	= m_multisampleStateParams;
		const std::vector<VkSampleMask>			sampleMask			(multisampleParams.rasterizationSamples / 32, (VkSampleMask)0);

		multisampleParams.pSampleMask = sampleMask.data();

		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, multisampleParams, m_colorBlendState);
		minSampleMaskImage = renderer.render();
	}

	// Render with all flags on
	{
		VkPipelineMultisampleStateCreateInfo	multisampleParams	= m_multisampleStateParams;
		const std::vector<VkSampleMask>			sampleMask			(multisampleParams.rasterizationSamples / 32, ~((VkSampleMask)0));

		multisampleParams.pSampleMask = sampleMask.data();

		MultisampleRenderer renderer (m_context, m_colorFormat, m_renderSize, m_primitiveTopology, m_vertices, multisampleParams, m_colorBlendState);
		maxSampleMaskImage = renderer.render();
	}

	return verifyImage(testSampleMaskImage->getAccess(), minSampleMaskImage->getAccess(), maxSampleMaskImage->getAccess());
}